

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
Compiler::detect_error<ParsedGame::ObjectsTokenType>
          (Compiler *this,Token<ParsedGame::ObjectsTokenType> *p_token,string *p_error_msg,
          bool p_is_warning)

{
  element_type *peVar1;
  undefined7 in_register_00000009;
  undefined8 uStack_d0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40 [32];
  
  if ((int)CONCAT71(in_register_00000009,p_is_warning) == 0) {
    this->m_has_error = true;
    uStack_d0 = 4;
  }
  else {
    uStack_d0 = 3;
  }
  peVar1 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string(local_40,(string *)&m_compiler_log_cat_abi_cxx11_);
  std::__cxx11::to_string(&local_c0,p_token->token_line);
  std::operator+(&local_a0,"(l.",&local_c0);
  std::operator+(&local_80,&local_a0,") : ");
  std::operator+(&local_60,&local_80,p_error_msg);
  (*peVar1->_vptr_PSLogger[2])(peVar1,uStack_d0,local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void Compiler::detect_error(Token<T> p_token, string p_error_msg, bool p_is_warning /*= false*/)
{
    if(!p_is_warning)
    {
        m_has_error = true;
    }
    m_logger->log(p_is_warning ? PSLogger::LogType::Warning : PSLogger::LogType::Error, m_compiler_log_cat, "(l." + to_string(p_token.token_line) + ") : " + p_error_msg);
}